

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseUicInclude
          (JobParseT *this,WorkerT *wrk,MetaT *meta,string *includeString)

{
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  UicSettingsT *this_00;
  cmQtAutoGeneratorMocUic *this_01;
  undefined1 local_70 [8];
  JobHandleT local_68;
  JobHandleT jobHandle;
  undefined1 local_50 [8];
  string uiInputFile;
  bool success;
  string *includeString_local;
  MetaT *meta_local;
  WorkerT *wrk_local;
  JobParseT *this_local;
  
  uiInputFile.field_2._M_local_buf[0xf] = '\0';
  UicFindIncludedFile((string *)local_50,this,wrk,meta,includeString);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00 = WorkerT::Uic(wrk);
    bVar2 = UicSettingsT::skipped(this_00,(string *)local_50);
    if (bVar2) {
      uiInputFile.field_2._M_local_buf[0xf] = '\x01';
    }
    else {
      std::
      make_unique<cmQtAutoGeneratorMocUic::JobUicT,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &this->FileName);
      std::
      unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>::
      unique_ptr<cmQtAutoGeneratorMocUic::JobUicT,std::default_delete<cmQtAutoGeneratorMocUic::JobUicT>,void>
                ((unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>
                  *)&local_68,
                 (unique_ptr<cmQtAutoGeneratorMocUic::JobUicT,_std::default_delete<cmQtAutoGeneratorMocUic::JobUicT>_>
                  *)local_70);
      std::
      unique_ptr<cmQtAutoGeneratorMocUic::JobUicT,_std::default_delete<cmQtAutoGeneratorMocUic::JobUicT>_>
      ::~unique_ptr((unique_ptr<cmQtAutoGeneratorMocUic::JobUicT,_std::default_delete<cmQtAutoGeneratorMocUic::JobUicT>_>
                     *)local_70);
      this_01 = WorkerT::Gen(wrk);
      uiInputFile.field_2._M_local_buf[0xf] = ParallelJobPushUic(this_01,&local_68);
      std::
      unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
      ::~unique_ptr(&local_68);
    }
  }
  uVar1 = uiInputFile.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseUicInclude(
  WorkerT& wrk, MetaT const& meta, std::string&& includeString)
{
  bool success = false;
  std::string uiInputFile = UicFindIncludedFile(wrk, meta, includeString);
  if (!uiInputFile.empty()) {
    if (!wrk.Uic().skipped(uiInputFile)) {
      JobHandleT jobHandle = cm::make_unique<JobUicT>(
        std::move(uiInputFile), FileName, std::move(includeString));
      success = wrk.Gen().ParallelJobPushUic(jobHandle);
    } else {
      // A skipped file is successful
      success = true;
    }
  }
  return success;
}